

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_FACopyDescriptor.H
# Opt level: O2

void __thiscall
amrex::FabArrayCopyDescriptor<amrex::FArrayBox>::FillFab
          (FabArrayCopyDescriptor<amrex::FArrayBox> *this,FabArrayId faid,FillBoxId *fillboxid,
          FArrayBox *destFab)

{
  _Base_ptr p_Var1;
  _Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_> _Var2;
  int srccomp;
  FCDMapIter fmi;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
  pVar3;
  int local_1c;
  
  local_1c = fillboxid->m_fillBoxId;
  pVar3 = std::
          _Rb_tree<int,_std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>,_std::_Select1st<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>
          ::equal_range(&(this->fabCopyDescList).
                         super__Vector_base<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>,_std::allocator<std::multimap<int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::FabCopyDescriptor<amrex::FArrayBox>_*>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[faid.fabArrayId]._M_t,&local_1c);
  for (_Var2 = pVar3.first._M_node; _Var2._M_node != pVar3.second._M_node._M_node;
      _Var2._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var2._M_node)) {
    p_Var1 = _Var2._M_node[1]._M_parent;
    srccomp = 0;
    if (p_Var1[2]._M_color == _S_red) {
      srccomp = *(int *)((long)&p_Var1[1]._M_left + 4);
    }
    BaseFab<double>::copy<(amrex::RunOn)1>
              (&destFab->super_BaseFab<double>,*(BaseFab<double> **)p_Var1,(Box *)&p_Var1->_M_parent
               ,srccomp,(Box *)&p_Var1->_M_parent,*(int *)&p_Var1[1]._M_right,
               *(int *)((long)&p_Var1[1]._M_right + 4));
  }
  return;
}

Assistant:

void
FabArrayCopyDescriptor<FAB>::FillFab (FabArrayId       faid,
                                      const FillBoxId& fillboxid,
                                      FAB&             destFab)
{
    BL_ASSERT(dataAvailable);

    std::pair<FCDMapIter,FCDMapIter> match = fabCopyDescList[faid.Id()].equal_range(fillboxid.Id());

    for (FCDMapIter fmi = match.first; fmi != match.second; ++fmi)
    {
        FabCopyDescriptor<FAB>* fcdp = (*fmi).second;

        BL_ASSERT(fcdp->fillBoxId == fillboxid.Id());

        destFab.template copy<RunOn::Host>
                   (*fcdp->localFabSource,
                     fcdp->subBox,
                     fcdp->fillType == FillLocally ? fcdp->srcComp : 0,
                     fcdp->subBox,
                     fcdp->destComp,
                     fcdp->nComp);
    }
}